

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::
insert<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::const_iterator>
          (Map<google::protobuf::MapKey,google::protobuf::MapValueRef> *this,const_iterator first,
          const_iterator last)

{
  bool bVar1;
  key_arg<google::protobuf::MapKey> *pkVar2;
  const_pointer pvVar3;
  MapValueRef *pMVar4;
  iterator local_58;
  undefined1 local_40 [8];
  iterator exist_it;
  const_iterator it;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this_local;
  
  exist_it.it_.bucket_index_ = (size_type)first.it_.node_;
  while (bVar1 = protobuf::operator!=((const_iterator *)&exist_it.it_.bucket_index_,&last), bVar1) {
    pkVar2 = (key_arg<google::protobuf::MapKey> *)
             Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
             operator->((const_iterator *)&exist_it.it_.bucket_index_);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::find<google::protobuf::MapKey>
              ((iterator *)local_40,
               (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)this,pkVar2);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end
              (&local_58,(Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)this);
    bVar1 = protobuf::operator==((iterator *)local_40,&local_58);
    if (bVar1) {
      pvVar3 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
               operator->((const_iterator *)&exist_it.it_.bucket_index_);
      pkVar2 = (key_arg<google::protobuf::MapKey> *)
               Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::
               operator->((const_iterator *)&exist_it.it_.bucket_index_);
      pMVar4 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::
               operator[]<google::protobuf::MapKey>
                         ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)this,
                          pkVar2);
      (pMVar4->super_MapValueConstRef).data_ = *(void **)(pvVar3 + 0x28);
      (pMVar4->super_MapValueConstRef).type_ = *(CppType *)(pvVar3 + 0x30);
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::const_iterator::operator++
              ((const_iterator *)&exist_it.it_.bucket_index_);
  }
  return;
}

Assistant:

void insert(InputIt first, InputIt last) {
    for (InputIt it = first; it != last; ++it) {
      iterator exist_it = find(it->first);
      if (exist_it == end()) {
        operator[](it->first) = it->second;
      }
    }
  }